

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::setInitialState
          (MultipleShootingTranscription *this,VectorDynSize *initialState)

{
  int iVar1;
  char *pcVar2;
  weak_ptr<iDynTree::optimalcontrol::DynamicalSystem> wVar3;
  __shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2> local_40;
  OptimalControlProblem local_30;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  if ((this->m_ocproblem).
      super___shared_ptr<iDynTree::optimalcontrol::OptimalControlProblem,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    pcVar2 = "The optimal control problem pointer is empty.";
  }
  else {
    OptimalControlProblem::dynamicalSystem((OptimalControlProblem *)&local_40);
    if (local_40._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_refcount);
    }
    else {
      iVar1 = (local_40._M_refcount._M_pi)->_M_use_count;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_refcount);
      if (iVar1 != 0) {
        wVar3 = OptimalControlProblem::dynamicalSystem(&local_30);
        std::__shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_40,&local_30,
                     wVar3.
                     super___weak_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi._M_pi);
        iVar1 = (*(local_40._M_ptr)->_vptr_DynamicalSystem[8])(local_40._M_ptr,initialState);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_28);
        if ((char)iVar1 != '\0') {
          return true;
        }
        pcVar2 = "Error while setting the initial state to the dynamical system.";
        goto LAB_00187a45;
      }
    }
    pcVar2 = "The optimal control problem does not point to any dynamical system.";
  }
LAB_00187a45:
  iDynTree::reportError("MultipleShootingTranscription","setInitialState",pcVar2);
  return false;
}

Assistant:

bool setInitialState(const VectorDynSize &initialState) {
                if (!(m_ocproblem)){
                    reportError("MultipleShootingTranscription", "setInitialState", "The optimal control problem pointer is empty.");
                    return false;
                }

                if (m_ocproblem->dynamicalSystem().expired()){
                    reportError("MultipleShootingTranscription", "setInitialState", "The optimal control problem does not point to any dynamical system.");
                    return false;
                }

                if (!(m_ocproblem->dynamicalSystem().lock()->setInitialState(initialState))){
                    reportError("MultipleShootingTranscription", "setInitialState", "Error while setting the initial state to the dynamical system.");
                    return false;
                }

                return true;
            }